

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O0

void __thiscall
LUPMatrix::LUPMatrix
          (LUPMatrix *this,Matrix *l,Matrix *u,Permutation *row_permutation,
          Permutation *column_permutation)

{
  bool bVar1;
  Permutation *column_permutation_local;
  Permutation *row_permutation_local;
  Matrix *u_local;
  Matrix *l_local;
  LUPMatrix *this_local;
  
  Matrix::Matrix(&this->l_,l);
  Matrix::Matrix(&this->u_,u);
  Permutation::Permutation(&this->row_permutation_,row_permutation);
  Permutation::Permutation(&this->column_permutation_,column_permutation);
  bVar1 = Matrix::IsLowerTriangular(&this->l_);
  if (!bVar1) {
    __assert_fail("l_.IsLowerTriangular()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/lup_matrix.cpp"
                  ,10,
                  "LUPMatrix::LUPMatrix(Matrix, Matrix, const Permutation &, const Permutation &)");
  }
  bVar1 = Matrix::IsUpperTriangular(&this->u_);
  if (!bVar1) {
    __assert_fail("u_.IsUpperTriangular()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/lup_matrix.cpp"
                  ,0xb,
                  "LUPMatrix::LUPMatrix(Matrix, Matrix, const Permutation &, const Permutation &)");
  }
  return;
}

Assistant:

LUPMatrix::LUPMatrix(Matrix l, Matrix u,
                     const Permutation& row_permutation,
                     const Permutation& column_permutation)
    : l_(std::move(l)),
      u_(std::move(u)),
      row_permutation_(row_permutation),
      column_permutation_(column_permutation) {
  assert(l_.IsLowerTriangular());
  assert(u_.IsUpperTriangular());
}